

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

Integer GAsizeof(Integer type)

{
  Integer type_local;
  Integer local_8;
  
  switch(type) {
  case 0x3e9:
    local_8 = 4;
    break;
  case 0x3ea:
    local_8 = 8;
    break;
  case 0x3eb:
    local_8 = 4;
    break;
  case 0x3ec:
    local_8 = 8;
    break;
  default:
    local_8 = 0;
    break;
  case 0x3ee:
    local_8 = 8;
    break;
  case 0x3ef:
    local_8 = 0x10;
    break;
  case 0x3f2:
    local_8 = 8;
    break;
  case 0x3f5:
    local_8 = 8;
    break;
  case 0x3f8:
    local_8 = 8;
  }
  return local_8;
}

Assistant:

Integer GAsizeof(Integer type)    
{
  switch (type) {
     case C_DBL  : return (sizeof(double));
     case C_INT  : return (sizeof(int));
     case C_SCPL : return (sizeof(SingleComplex));
     case C_DCPL : return (sizeof(DoubleComplex));
     case C_FLOAT : return (sizeof(float));
     case C_LONG : return (sizeof(long));
     case C_LONGLONG : return (sizeof(long long));
     case F_DBL : return (sizeof(DoublePrecision));
     case F_INT  : return (sizeof(Integer));
          default   : return 0; 
  }
}